

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_priority_deque.cpp
# Opt level: O0

void __thiscall priority_deque_iterator::test_method(priority_deque_iterator *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_1c8;
  basic_cstring<const_char> local_1b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1a8;
  multiset<int,_std::less<int>,_std::allocator<int>_> local_188;
  undefined1 local_153;
  bool local_152;
  value_expr<bool> local_151;
  assertion_result local_150;
  basic_cstring<const_char> local_138;
  basic_cstring<const_char> local_128;
  _Base_ptr local_118;
  int local_110;
  int local_10c;
  int pushed;
  int i;
  multiset<int,_std::less<int>,_std::allocator<int>_> existing_elements;
  basic_cstring<const_char> local_c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  undefined1 local_83;
  bool local_82;
  value_expr<bool> local_81;
  assertion_result local_80;
  basic_cstring<const_char> local_68 [2];
  basic_cstring<const_char> local_48;
  undefined1 local_38 [8];
  priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> pd;
  int push_count;
  priority_deque_iterator *this_local;
  
  for (pd._28_4_ = 1; (int)pd._28_4_ < 8; pd._28_4_ = pd._28_4_ + 1) {
    boost::container::priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>::
    priority_deque((priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> *)
                   local_38);
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
                 ,0x73);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(local_68);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_48,0x11d,local_68);
      local_90._M_current =
           (int *)boost::container::
                  priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>::
                  begin((priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>
                         *)local_38);
      local_98._M_current =
           (int *)boost::container::
                  priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>::end
                            ((priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>
                              *)local_38);
      local_83 = __gnu_cxx::operator==(&local_90,&local_98);
      boost::test_tools::assertion::seed::operator->*((seed *)&local_81,&local_82);
      boost::test_tools::assertion::value_expr<bool>::evaluate(&local_80,&local_81,false);
      plVar3 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_c8,"(pd.begin() == pd.end())",0x18);
      boost::unit_test::operator<<(&local_b8,plVar3,&local_c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 &existing_elements._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
                 ,0x73);
      boost::test_tools::tt_detail::report_assertion
                (&local_80,&local_b8.super_lazy_ostream,
                 (const_string *)&existing_elements._M_t._M_impl.super__Rb_tree_header._M_node_count
                 ,0x11d,REQUIRE,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_b8);
      boost::test_tools::assertion_result::~assertion_result(&local_80);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::multiset<int,_std::less<int>,_std::allocator<int>_>::multiset
              ((multiset<int,_std::less<int>,_std::allocator<int>_> *)&pushed);
    for (local_10c = 0; local_10c < (int)pd._28_4_; local_10c = local_10c + 1) {
      local_110 = rand();
      local_118 = (_Base_ptr)
                  std::multiset<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((multiset<int,_std::less<int>,_std::allocator<int>_> *)&pushed,
                             &local_110);
      boost::container::priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>
      ::push((priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> *)
             local_38,&local_110);
    }
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_128,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
                 ,0x73);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_138);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_128,0x127,&local_138);
      std::multiset<int,_std::less<int>,_std::allocator<int>_>::multiset
                (&local_188,(multiset<int,_std::less<int>,_std::allocator<int>_> *)&pushed);
      local_153 = (anonymous_namespace)::
                  have_same_elements<boost::container::priority_deque<int,std::vector<int,std::allocator<int>>,std::less<int>>,int>
                            ((priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>
                              *)local_38,&local_188);
      boost::test_tools::assertion::seed::operator->*((seed *)&local_151,&local_152);
      boost::test_tools::assertion::value_expr<bool>::evaluate(&local_150,&local_151,false);
      plVar3 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1b8,"have_same_elements(pd, existing_elements)",0x29);
      boost::unit_test::operator<<(&local_1a8,plVar3,&local_1b8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
                 ,0x73);
      boost::test_tools::tt_detail::report_assertion
                (&local_150,&local_1a8.super_lazy_ostream,&local_1c8,0x127,REQUIRE,
                 CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_1a8);
      boost::test_tools::assertion_result::~assertion_result(&local_150);
      std::multiset<int,_std::less<int>,_std::allocator<int>_>::~multiset(&local_188);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::multiset<int,_std::less<int>,_std::allocator<int>_>::~multiset
              ((multiset<int,_std::less<int>,_std::allocator<int>_> *)&pushed);
    boost::container::priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>::
    ~priority_deque((priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> *)
                    local_38);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( priority_deque_iterator )
{
  using namespace boost::container;
  for (int push_count = 1; push_count < 8; ++push_count)
  {
    priority_deque<int> pd;
    BOOST_TEST_REQUIRE((pd.begin() == pd.end()));

    std::multiset<int> existing_elements;
    for (int i = 0; i < push_count; ++i)
    {
      int pushed = rand();
      existing_elements.insert(pushed);
      pd.push(pushed);
    }

    BOOST_TEST_REQUIRE(have_same_elements(pd, existing_elements));
  }
}